

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

Mini_Lut_t * Gia_ManToMiniLut(Gia_Man_t *pGia)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  size_t __n;
  Gia_Obj_t *pGVar3;
  word wVar4;
  Vec_Wrd_t *pVVar5;
  bool bVar6;
  int w;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  void *__s;
  Mini_Lut_t *p;
  uint *puVar13;
  Vec_Int_t *pVVar14;
  Vec_Bit_t *__ptr;
  word *pwVar15;
  ulong uVar16;
  word *pwVar17;
  byte bVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  word *pLimit;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  word *pwVar26;
  int Fanin;
  int pVars [16];
  uint local_d4;
  uint local_a4;
  long local_a0;
  long local_98;
  Gia_Obj_t *local_90;
  int *local_88;
  int *local_80;
  uint local_78 [18];
  
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nCap = 0x10;
  pVVar11->nSize = 0;
  piVar12 = (int *)malloc(0x40);
  pVVar11->pArray = piVar12;
  iVar10 = pGia->nObjs;
  lVar23 = (long)iVar10;
  iVar7 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar7 = iVar10;
  }
  if (iVar7 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar7 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,lVar23 * 4);
  }
  local_a0 = lVar23;
  if (pGia->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x137,"Mini_Lut_t *Gia_ManToMiniLut(Gia_Man_t *)");
  }
  iVar7 = Gia_ManLutSizeMax(pGia);
  iVar10 = 2;
  if (2 < iVar7) {
    iVar10 = iVar7;
  }
  local_d4 = 1 << ((char)iVar10 - 6U & 0x1f);
  if (iVar7 < 7) {
    local_d4 = 1;
  }
  if (0x10 < iVar7) {
    __assert_fail("LutSize >= 2 && LutSize <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/miniaig/minilut.h"
                  ,0x96,"Mini_Lut_t *Mini_LutStart(int)");
  }
  p = (Mini_Lut_t *)calloc(1,0x20);
  p->LutSize = iVar10;
  p->nCap = 0xff;
  piVar12 = (int *)malloc((ulong)(uint)(iVar10 * 0xff) << 2);
  p->pArray = piVar12;
  iVar8 = 0xff << ((char)iVar10 - 5U & 0x1f);
  if (iVar7 < 6) {
    iVar8 = 0xff;
  }
  puVar13 = (uint *)malloc((long)iVar8 << 2);
  p->pTruths = puVar13;
  Mini_LutPush(p,0,(int *)0x0,(uint *)0x0);
  Mini_LutPush(p,0,(int *)0x0,(uint *)0x0);
  uVar9 = 1 << ((char)p->LutSize - 5U & 0x1f);
  if (p->LutSize < 6) {
    uVar9 = 1;
  }
  if (0 < (int)uVar9) {
    puVar13 = p->pTruths;
    __n = (ulong)uVar9 * 4;
    memset(puVar13,0,__n);
    memset(puVar13 + uVar9,0xff,__n);
  }
  Gia_ManFillValue(pGia);
  pGia->pObjs->Value = 0;
  pVVar14 = pGia->vCis;
  if (0 < pVVar14->nSize) {
    lVar23 = 0;
    do {
      iVar7 = pVVar14->pArray[lVar23];
      if (((long)iVar7 < 0) || (pGia->nObjs <= iVar7)) goto LAB_00777808;
      pGVar3 = pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      Mini_LutPush(p,0,(int *)0x0,(uint *)0x0);
      pGVar3[iVar7].Value = p->nSize - 1;
      lVar23 = lVar23 + 1;
      pVVar14 = pGia->vCis;
    } while (lVar23 < pVVar14->nSize);
  }
  __ptr = Gia_ManFindComplLuts(pGia);
  Gia_ObjComputeTruthTableStart(pGia,iVar10);
  if (1 < pGia->nObjs) {
    local_98 = (long)(int)local_d4;
    uVar22 = 1;
    do {
      if ((long)pGia->vMapping->nSize <= (long)uVar22) goto LAB_007777e9;
      if (pGia->vMapping->pArray[uVar22] != 0) {
        pVVar11->nSize = 0;
        pVVar14 = pGia->vMapping;
        lVar23 = (long)pVVar14->nSize;
        if (lVar23 <= (long)uVar22) goto LAB_007777e9;
        lVar24 = 0;
        while( true ) {
          piVar12 = pVVar14->pArray;
          lVar19 = (long)piVar12[uVar22];
          if ((lVar19 < 0) || ((int)lVar23 <= piVar12[uVar22])) goto LAB_007777e9;
          if (piVar12[lVar19] <= lVar24) break;
          Vec_IntPush(pVVar11,piVar12[lVar19 + lVar24 + 1]);
          lVar24 = lVar24 + 1;
          pVVar14 = pGia->vMapping;
          lVar23 = (long)pVVar14->nSize;
          if (lVar23 <= (long)uVar22) goto LAB_007777e9;
        }
        if (6 < pVVar11->nSize) {
          uVar16 = (ulong)(pVVar11->nSize - 7);
          uVar20 = uVar16;
          do {
            if ((long)pVVar11->nSize <= (long)uVar20) goto LAB_007777e9;
            Vec_IntPush(pVVar11,pVVar11->pArray[uVar20]);
            bVar6 = 0 < (long)uVar20;
            uVar20 = uVar20 - 1;
          } while (bVar6);
          do {
            iVar10 = (int)uVar16;
            if (pVVar11->nSize <= iVar10) {
              __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
            }
            iVar7 = pVVar11->nSize + -1;
            pVVar11->nSize = iVar7;
            if (iVar10 < iVar7) {
              piVar12 = pVVar11->pArray;
              uVar20 = uVar16;
              do {
                piVar12[uVar20] = piVar12[uVar20 + 1];
                uVar20 = uVar20 + 1;
              } while ((long)uVar20 < (long)pVVar11->nSize);
            }
            uVar16 = uVar16 - 1;
          } while (0 < iVar10);
          iVar10 = pGia->vMapping->nSize;
          if ((long)iVar10 <= (long)uVar22) goto LAB_007777e9;
          piVar12 = pGia->vMapping->pArray;
          iVar7 = piVar12[uVar22];
          if (((long)iVar7 < 0) || (iVar10 <= iVar7)) goto LAB_007777e9;
          if (pVVar11->nSize != piVar12[iVar7]) {
            __assert_fail("Vec_IntSize(vLeaves) == Gia_ObjLutSize(pGia, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                          ,0x152,"Mini_Lut_t *Gia_ManToMiniLut(Gia_Man_t *)");
          }
        }
        iVar10 = pVVar11->nSize;
        if (0 < (long)iVar10) {
          piVar12 = pVVar11->pArray;
          lVar23 = 0;
          do {
            iVar7 = piVar12[lVar23];
            if (((long)iVar7 < 0) || (pGia->nObjs <= iVar7)) goto LAB_00777808;
            if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
            local_78[lVar23] = pGia->pObjs[iVar7].Value;
            lVar23 = lVar23 + 1;
          } while (iVar10 != lVar23);
        }
        if ((long)pGia->nObjs <= (long)uVar22) goto LAB_00777808;
        local_90 = pGia->pObjs + uVar22;
        pwVar15 = Gia_ObjComputeTruthTableCut(pGia,local_90,pVVar11);
        iVar10 = __ptr->nSize;
        if ((long)iVar10 <= (long)uVar22) goto LAB_00777827;
        local_80 = __ptr->pArray;
        if (((uint)local_80[uVar22 >> 5 & 0x7ffffff] >> ((uint)uVar22 & 0x1f) & 1) != 0 &&
            0 < (int)local_d4) {
          uVar16 = 0;
          do {
            pwVar15[uVar16] = ~pwVar15[uVar16];
            uVar16 = uVar16 + 1;
          } while (local_d4 != uVar16);
        }
        iVar7 = pVVar11->nSize;
        if (0 < (long)iVar7) {
          local_88 = pVVar11->pArray;
          uVar16 = 0;
          do {
            uVar9 = local_88[uVar16];
            if (((int)uVar9 < 0) || (iVar10 <= (int)uVar9)) goto LAB_00777827;
            if (((uint)local_80[uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0) {
              if (local_d4 == 1) {
                bVar18 = (byte)(1 << ((byte)uVar16 & 0x1f));
                *pwVar15 = (s_Truths6[uVar16] & *pwVar15) >> (bVar18 & 0x3f) |
                           *pwVar15 << (bVar18 & 0x3f) & s_Truths6[uVar16];
              }
              else if (uVar16 < 6) {
                if (0 < (int)local_d4) {
                  uVar20 = s_Truths6[uVar16];
                  uVar25 = 0;
                  do {
                    bVar18 = (byte)(1 << ((byte)uVar16 & 0x1f));
                    pwVar15[uVar25] =
                         (pwVar15[uVar25] & uVar20) >> (bVar18 & 0x3f) |
                         pwVar15[uVar25] << (bVar18 & 0x3f) & uVar20;
                    uVar25 = uVar25 + 1;
                  } while (local_d4 != uVar25);
                }
              }
              else if (0 < (int)local_d4) {
                bVar18 = (byte)(uVar16 - 6);
                uVar9 = 1 << (bVar18 & 0x1f);
                iVar8 = 2 << (bVar18 & 0x1f);
                uVar20 = 1;
                if (1 < (int)uVar9) {
                  uVar20 = (ulong)uVar9;
                }
                pwVar26 = pwVar15 + (int)uVar9;
                pwVar17 = pwVar15;
                do {
                  if (uVar16 - 6 != 0x1f) {
                    uVar25 = 0;
                    do {
                      wVar4 = pwVar17[uVar25];
                      pwVar17[uVar25] = pwVar26[uVar25];
                      pwVar26[uVar25] = wVar4;
                      uVar25 = uVar25 + 1;
                    } while (uVar20 != uVar25);
                  }
                  pwVar17 = pwVar17 + iVar8;
                  pwVar26 = pwVar26 + iVar8;
                } while (pwVar17 < pwVar15 + local_98);
              }
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 != (long)iVar7);
        }
        iVar10 = pGia->vMapping->nSize;
        if ((long)iVar10 <= (long)uVar22) goto LAB_007777e9;
        piVar12 = pGia->vMapping->pArray;
        iVar7 = piVar12[uVar22];
        if (((long)iVar7 < 0) || (iVar10 <= iVar7)) goto LAB_007777e9;
        uVar9 = Mini_LutCreateNode(p,piVar12[iVar7],(int *)local_78,(uint *)pwVar15);
        local_90->Value = uVar9;
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)pGia->nObjs);
  }
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
    pVVar11->pArray = (int *)0x0;
  }
  free(pVVar11);
  lVar23 = local_a0;
  pGia->vTtMemory->nSize = 0;
  if (0 < (int)local_d4) {
    do {
      pVVar5 = pGia->vTtMemory;
      uVar9 = pVVar5->nCap;
      if (pVVar5->nSize == uVar9) {
        if ((int)uVar9 < 0x10) {
          if (pVVar5->pArray == (word *)0x0) {
            pwVar15 = (word *)malloc(0x80);
          }
          else {
            pwVar15 = (word *)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = pwVar15;
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar9 * 2;
          if (iVar10 <= (int)uVar9) goto LAB_00777633;
          if (pVVar5->pArray == (word *)0x0) {
            pwVar15 = (word *)malloc((ulong)uVar9 << 4);
          }
          else {
            pwVar15 = (word *)realloc(pVVar5->pArray,(ulong)uVar9 << 4);
          }
          pVVar5->pArray = pwVar15;
        }
        if (pwVar15 == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        pVVar5->nCap = iVar10;
      }
LAB_00777633:
      iVar10 = pVVar5->nSize;
      pVVar5->nSize = iVar10 + 1;
      pVVar5->pArray[iVar10] = 0x5555555555555555;
      local_d4 = local_d4 - 1;
    } while (local_d4 != 0);
  }
  pVVar11 = pGia->vCos;
  if (0 < pVVar11->nSize) {
    pwVar15 = pGia->vTtMemory->pArray;
    lVar24 = 0;
    do {
      iVar10 = pVVar11->pArray[lVar24];
      if (((long)iVar10 < 0) || (pGia->nObjs <= iVar10)) {
LAB_00777808:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = pGia->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar1 = pGVar3 + iVar10;
      uVar21 = (uint)*(undefined8 *)pGVar1 & 0x1fffffff;
      pGVar2 = pGVar1 + -(ulong)uVar21;
      uVar9 = (uint)*(undefined8 *)pGVar1 >> 0x1d;
      if (pGVar2 == pGVar3) {
        uVar9 = uVar9 & 1;
LAB_0077770c:
        uVar9 = Mini_LutCreatePo(p,uVar9);
        pGVar1->Value = uVar9;
      }
      else {
        if (pGia->nObjs <= iVar10) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar21 = iVar10 - uVar21;
        if (((int)uVar21 < 0) || (__ptr->nSize <= (int)uVar21)) {
LAB_00777827:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((((uint)__ptr->pArray[uVar21 >> 5] >> ((byte)uVar21 & 0x1f) ^ uVar9) & 1) == 0) {
          uVar9 = pGVar2->Value;
          goto LAB_0077770c;
        }
        local_a4 = pGVar2->Value;
        lVar19 = (long)(int)local_a4;
        if ((lVar19 < 0) || ((int)lVar23 <= (int)local_a4)) {
LAB_007777e9:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar10 = *(int *)((long)__s + lVar19 * 4);
        if (iVar10 == 0) {
          iVar10 = Mini_LutCreateNode(p,1,(int *)&local_a4,(uint *)pwVar15);
          *(int *)((long)__s + lVar19 * 4) = iVar10;
        }
        uVar9 = Mini_LutCreatePo(p,iVar10);
        pGVar1->Value = uVar9;
      }
      lVar24 = lVar24 + 1;
      pVVar11 = pGia->vCos;
    } while (lVar24 < pVVar11->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Bit_t *)0x0) {
    free(__ptr);
  }
  Gia_ObjComputeTruthTableStop(pGia);
  p->nRegs = pGia->nRegs;
  return p;
}

Assistant:

Mini_Lut_t * Gia_ManToMiniLut( Gia_Man_t * pGia )
{
    Mini_Lut_t * p;
    Vec_Bit_t * vMarks;
    Gia_Obj_t * pObj, * pFanin;
    Vec_Int_t * vLeaves = Vec_IntAlloc( 16 );
    Vec_Int_t * vInvMap = Vec_IntStart( Gia_ManObjNum(pGia) );
    int i, k, iFanin, LutSize, nWords, Count = 0, pVars[16];
    word * pTruth;
    assert( Gia_ManHasMapping(pGia) );
    LutSize = Gia_ManLutSizeMax( pGia );
    LutSize = Abc_MaxInt( LutSize, 2 );
    nWords  = Abc_Truth6WordNum( LutSize );
    assert( LutSize >= 2 );
    // create the manager
    p = Mini_LutStart( LutSize );
    // create primary inputs
    Gia_ManFillValue( pGia );
    Gia_ManConst0(pGia)->Value = 0;
    Gia_ManForEachCi( pGia, pObj, i )
        pObj->Value = Mini_LutCreatePi(p);
    // create internal nodes
    vMarks = Gia_ManFindComplLuts( pGia );
    Gia_ObjComputeTruthTableStart( pGia, LutSize );
    Gia_ManForEachLut( pGia, i )
    {
        Vec_IntClear( vLeaves );
        Gia_LutForEachFanin( pGia, i, iFanin, k )
            Vec_IntPush( vLeaves, iFanin );
        if ( Vec_IntSize(vLeaves) > 6 )
        {
            int Extra = Vec_IntSize(vLeaves) - 7;
            for ( k = Extra; k >= 0; k-- )
                Vec_IntPush( vLeaves, Vec_IntEntry(vLeaves, k) );
            for ( k = Extra; k >= 0; k-- )
                Vec_IntDrop( vLeaves, k );
            assert( Vec_IntSize(vLeaves) == Gia_ObjLutSize(pGia, i) );
        }
        Gia_ManForEachObjVec( vLeaves, pGia, pFanin, k )
            pVars[k] = pFanin->Value;
        pObj = Gia_ManObj( pGia, i );
        pTruth = Gia_ObjComputeTruthTableCut( pGia, pObj, vLeaves );
        if ( Vec_BitEntry(vMarks, i) )
            Abc_TtNot( pTruth, nWords );
        Vec_IntForEachEntry( vLeaves, iFanin, k )
            if ( Vec_BitEntry(vMarks, iFanin) )
                Abc_TtFlip( pTruth, nWords, k );
        pObj->Value = Mini_LutCreateNode( p, Gia_ObjLutSize(pGia, i), pVars, (unsigned *)pTruth );
    }
    Vec_IntFree( vLeaves );
    // create inverter truth table
    Vec_WrdClear( pGia->vTtMemory );
    for ( i = 0; i < nWords; i++ )
        Vec_WrdPush( pGia->vTtMemory, ABC_CONST(0x5555555555555555) );
    pTruth = Vec_WrdArray( pGia->vTtMemory );
    // create primary outputs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        if ( Gia_ObjFanin0(pObj) == Gia_ManConst0(pGia) )
            pObj->Value = Mini_LutCreatePo( p, Gia_ObjFaninC0(pObj) );
        else if ( Gia_ObjFaninC0(pObj) == Vec_BitEntry(vMarks, Gia_ObjFaninId0p(pGia, pObj)) )
            pObj->Value = Mini_LutCreatePo( p, Gia_ObjFanin0(pObj)->Value );
        else // add inverter LUT
        {
            int LutInv, Fanin = Gia_ObjFanin0(pObj)->Value;
            if ( (LutInv = Vec_IntEntry(vInvMap, Fanin)) == 0 )
            {
                LutInv = Mini_LutCreateNode( p, 1, &Fanin, (unsigned *)pTruth );
                Vec_IntWriteEntry( vInvMap, Fanin, LutInv );
                Count++;
            }
            pObj->Value = Mini_LutCreatePo( p, LutInv );
        }
    }
    Vec_IntFree( vInvMap );
    Vec_BitFree( vMarks );
    Gia_ObjComputeTruthTableStop( pGia );
    // set registers
    Mini_LutSetRegNum( p, Gia_ManRegNum(pGia) );
    //Mini_LutPrintStats( p );
    //printf( "Added %d inverters.\n", Count );
    return p;
}